

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall soul::AST::ComplexMemberRef::~ComplexMemberRef(ComplexMemberRef *this)

{
  ComplexMemberRef *this_local;
  
  ~ComplexMemberRef(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

ComplexMemberRef (const Context& c, Expression& o, Type t, std::string member)
            : Expression (ObjectType::ComplexMemberRef, c, ExpressionKind::value),
              object (o), complexType (t), memberName (std::move (member))
        {
            SOUL_ASSERT (t.isComplex());
            SOUL_ASSERT (isPossiblyValue (object.get()));

            if (complexType.isVector())
                memberType = Type::createVector (complexType.getElementType().isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64, complexType.getVectorSize());
            else
                memberType = complexType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64;
        }